

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.cpp
# Opt level: O2

void __thiscall
tiger::trains::Runner::Runner
          (Runner *this,char *name,char *addr,int port,char *gameName,int playersNum)

{
  this->_vptr_Runner = (_func_int **)&PTR__Runner_0019a350;
  this->name = name;
  this->addr = addr;
  this->port = port;
  this->gameName = gameName;
  this->playersNum = playersNum;
  memset(&this->world,0,0x350);
  world::World::World(&this->world);
  this->bot = (IBot *)0x0;
  return;
}

Assistant:

Runner::Runner(const char *name, const char *addr, int port, const char *gameName, const int playersNum)
    : name(name), addr(addr), port(port), gameName(gameName), playersNum(playersNum), world(),bot(nullptr)
{

}